

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialogs.cpp
# Opt level: O0

void show_plugin_properties_dlg
               (void *hMainWnd,string *config_path,tExtensionStartupInfo *pExtension)

{
  tDialogBoxLFMProc p_Var1;
  char *pcVar2;
  bool bVar3;
  byte bVar4;
  streambuf *psVar5;
  size_t sVar6;
  string local_410;
  undefined1 local_3f0 [24];
  string error;
  stringstream body;
  ostream local_3b0 [392];
  long local_228;
  ifstream ifs;
  tExtensionStartupInfo *pExtension_local;
  string *config_path_local;
  void *hMainWnd_local;
  
  gExtension = pExtension;
  std::__cxx11::string::operator=((string *)&gConfig_path_abi_cxx11_,(string *)config_path);
  std::ifstream::ifstream(&local_228);
  std::operator|(_S_bin,_S_in);
  std::ifstream::open((string *)&local_228,(_Ios_Openmode)config_path);
  bVar3 = std::ios::operator_cast_to_bool((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar3) && (bVar4 = std::ios::bad(), (bVar4 & 1) == 0)) {
    std::__cxx11::stringstream::stringstream((stringstream *)(error.field_2._M_local_buf + 8));
    psVar5 = (streambuf *)std::ifstream::rdbuf();
    std::ostream::operator<<(local_3b0,psVar5);
    std::ifstream::close();
    std::__cxx11::string::string((string *)(local_3f0 + 0x10));
    std::__cxx11::stringstream::str();
    json11::Json::parse((string *)local_3f0,&local_410,(int)local_3f0 + 0x10);
    json11::Json::operator=(&gJson,(Json *)local_3f0);
    json11::Json::~Json((Json *)local_3f0);
    std::__cxx11::string::~string((string *)&local_410);
    std::__cxx11::string::~string((string *)(local_3f0 + 0x10));
    std::__cxx11::stringstream::~stringstream((stringstream *)(error.field_2._M_local_buf + 8));
  }
  pcVar2 = config_dialog;
  p_Var1 = gExtension->DialogBoxLFM;
  sVar6 = strlen(config_dialog);
  (*p_Var1)((intptr_t)pcVar2,sVar6,DlgProc);
  std::ifstream::~ifstream(&local_228);
  return;
}

Assistant:

void show_plugin_properties_dlg(void *hMainWnd, std::string config_path, tExtensionStartupInfo *pExtension)
{
    gExtension = pExtension;
    gConfig_path = config_path;

    std::ifstream ifs;
    ifs.open(config_path, std::ios::binary | std::ofstream::in);
    if (ifs && !ifs.bad()) {
        std::stringstream body;
        body << ifs.rdbuf();
        ifs.close();

        std::string error;
        gJson = json11::Json::parse(body.str(), error);
    }

    gExtension->DialogBoxLFM((intptr_t)config_dialog, strlen(config_dialog), DlgProc);
}